

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_udp.cpp
# Opt level: O2

TransportUDPPtr __thiscall
miniros::TransportUDP::createOutgoing
          (TransportUDP *this,string *host,int port,int connection_id,int max_datagram_size)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  int iVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  TransportUDPPtr TVar3;
  allocator<char> local_69;
  TransportUDPPtr transport;
  int max_datagram_size_local;
  string local_48;
  
  std::make_shared<miniros::TransportUDP,miniros::PollSet*&,int&,int&>
            ((PollSet **)&transport,(int *)(host[8].field_2._M_local_buf + 8),(int *)(host + 9));
  iVar2 = connect(transport.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr,port,(sockaddr *)(ulong)(uint)connection_id,max_datagram_size);
  _Var1 = transport.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  if ((char)iVar2 == '\0') {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (createOutgoing::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"miniros.transport_udp",&local_69);
      console::initializeLogLocation(&createOutgoing::loc,&local_48,Error);
      std::__cxx11::string::~string((string *)&local_48);
    }
    if (createOutgoing::loc.level_ != Error) {
      console::setLogLocationLevel(&createOutgoing::loc,Error);
      console::checkLogLocationEnabled(&createOutgoing::loc);
    }
    if (createOutgoing::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,createOutgoing::loc.logger_,createOutgoing::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_udp.cpp"
                     ,0x2be,
                     "TransportUDPPtr miniros::TransportUDP::createOutgoing(std::string, int, int, int)"
                     ,"Failed to create outgoing connection");
    }
    (this->super_Transport)._vptr_Transport = (_func_int **)0x0;
    (this->super_Transport).super_enable_shared_from_this<miniros::Transport>._M_weak_this.
    super___weak_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  else {
    transport.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_Transport)._vptr_Transport =
         (_func_int **)
         transport.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_Transport).super_enable_shared_from_this<miniros::Transport>._M_weak_this.
    super___weak_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var1._M_pi;
    transport.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&transport.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  TVar3.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  TVar3.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (TransportUDPPtr)
         TVar3.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TransportUDPPtr TransportUDP::createOutgoing(std::string host, int port, int connection_id, int max_datagram_size)
{
  MINIROS_ASSERT(is_server_);
  
  TransportUDPPtr transport(std::make_shared<TransportUDP>(poll_set_, flags_, max_datagram_size));
  if (!transport->connect(host, port, connection_id))
  {
    MINIROS_ERROR("Failed to create outgoing connection");
    return TransportUDPPtr();
  }
  return transport;

}